

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O2

void lj_tab_clear(GCtab *t)

{
  uint uVar1;
  Node *node;
  long lVar2;
  ulong uVar3;
  long lVar4;
  
  node = (Node *)(ulong)(t->array).ptr32;
  uVar1 = t->asize;
  for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
    *(undefined4 *)((long)&node->val + uVar3 * 8 + 4) = 0xffffffff;
  }
  if (t->hmask != 0) {
    uVar1 = (t->node).ptr32;
    uVar3 = (ulong)uVar1;
    lVar2 = (ulong)(t->hmask + 1) * 0x18;
    *(uint *)(uVar3 + 0x14) = (int)lVar2 + uVar1;
    for (lVar4 = 0; lVar2 - lVar4 != 0; lVar4 = lVar4 + 0x18) {
      *(undefined8 *)(uVar3 + 0xc + lVar4) = 0xffffffff;
      *(undefined4 *)(uVar3 + 4 + lVar4) = 0xffffffff;
    }
  }
  return;
}

Assistant:

static LJ_AINLINE void clearapart(GCtab *t)
{
  uint32_t i, asize = t->asize;
  TValue *array = tvref(t->array);
  for (i = 0; i < asize; i++)
    setnilV(&array[i]);
}